

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O3

void updateHeader(WINDOW *header,Map *map)

{
  int iVar1;
  
  wclear();
  wborder(header,0,0,0,0,0,0,0,0);
  mvwprintw(header,1,1,"Level %d: %s",map->levelNo,map);
  mvwprintw(header,1,0x38,"Panic:%d%%",map->panicMax);
  mvwprintw(header,1,0x45,"Rep:%d",map->repMax);
  iVar1 = wmove(header,0,1);
  if (iVar1 != -1) {
    waddnstr(header,"riot",0xffffffff);
  }
  iVar1 = wmove(header,2,0);
  if (iVar1 != -1) {
    waddch(header,_DAT_00109278);
  }
  iVar1 = wmove(header,2,0x4f);
  if (iVar1 != -1) {
    waddch(header,_DAT_0010927c);
    return;
  }
  return;
}

Assistant:

void updateHeader(WINDOW *header, struct Map *map) {
    wclear(header);
    box(header, 0, 0);
    mvwprintw(header, 1, 1, "Level %d: %s", map->levelNo,
        map->name); // Display Level
    mvwprintw(header, 1, MAX_COLS - 24, "Panic:%d%%",
        map->panicMax); // Display Panic
    mvwprintw(header, 1, MAX_COLS - 11, "Rep:%d",
        map->repMax); // Display Rep
    mvwaddstr(header, 0, 1, "riot");
    mvwaddch (header, 2, 0, ACS_LTEE);
    mvwaddch (header, 2, MAX_COLS - 1, ACS_RTEE);
}